

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O1

bool __thiscall
Trie::matchAll(Trie *this,string *src,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *outVect)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  ushort uVar3;
  mapped_type *pptVar4;
  _Base_ptr p_Var5;
  long lVar6;
  pointer puVar7;
  _Base_ptr p_Var8;
  char cVar9;
  trie_node_t *ptVar10;
  bool bVar11;
  uint16_t index;
  string temp;
  Unicode _unicode;
  undefined2 local_7a;
  value_type local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  ushort *local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  ptVar10 = this->root;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (ushort *)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (ushort *)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = outVect;
  Limonp::utf8ToUnicode((src->_M_dataplus)._M_p,(uint)src->_M_string_length,&local_48);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_50 = local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar7 = local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_7a = *puVar7;
      for (; ptVar10 != (mapped_type)0x0; ptVar10 = ptVar10->search_clue) {
        p_Var1 = &(ptVar10->nextMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (ptVar10->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar11]) {
          bVar11 = (ushort)(short)p_Var8[1]._M_color < (ushort)local_7a;
          if (!bVar11) {
            p_Var5 = p_Var8;
          }
        }
        p_Var8 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var8 = p_Var5, (ushort)local_7a < (ushort)(short)p_Var5[1]._M_color)) {
          p_Var8 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 != p_Var1) {
          pptVar4 = std::
                    map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                    ::operator[](&ptVar10->nextMap,&local_7a);
          ptVar10 = *pptVar4;
          goto LAB_00105793;
        }
      }
      ptVar10 = (mapped_type)0x0;
LAB_00105793:
      if (ptVar10 == (mapped_type)0x0) {
        ptVar10 = this->root;
      }
      else if (ptVar10->infoIndex != -1) {
        local_78._M_string_length = 0;
        *local_78._M_dataplus._M_p = '\0';
        bVar2 = (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start[ptVar10->infoIndex];
        if (bVar2 != 0) {
          local_78._M_string_length = 0;
          *local_78._M_dataplus._M_p = '\0';
          lVar6 = -(ulong)((uint)bVar2 * 2);
          do {
            uVar3 = *(ushort *)((long)puVar7 + lVar6 + 2);
            cVar9 = (char)&local_78;
            if (0x7f < uVar3) {
              if (uVar3 < 0x800) {
                std::__cxx11::string::push_back(cVar9);
              }
              else {
                std::__cxx11::string::push_back(cVar9);
                std::__cxx11::string::push_back(cVar9);
              }
            }
            std::__cxx11::string::push_back(cVar9);
            lVar6 = lVar6 + 2;
          } while (lVar6 != 0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_58,&local_78);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (ushort *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool Trie::matchAll(const string &src, vector<string> &outVect)
{
	trie_node_t *node = root;
	uint16_t index;
    Unicode _unicode;
	decode(src, _unicode);
	auto iter = _unicode.begin();
	auto begin = iter, last = iter;
	auto end = _unicode.end();
	string temp;
    for( ; iter != end; iter++ ) {
		index = *iter;
		for ( ; ; ) {
			if ( node == NULL ) {
				break;
			} else if ( node->nextMap.find(index) == node->nextMap.end() ) {
			    node = node->search_clue;
			} else {
				node = node->nextMap[index];
				break;
			}
		}
	    if ( node == NULL ) {
			node = root;
		} else	{
			if ( node->infoIndex != -1 ) {
				temp.clear();
				last = iter - lengthVect[node->infoIndex] + 1;
                encode(last, iter+1 , temp);
                outVect.push_back(temp);
			}
		}
	}
	return true;
}